

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
TransactionContext_SplitTxOutByAddress_Test::TestBody
          (TransactionContext_SplitTxOutByAddress_Test *this)

{
  initializer_list<cfd::core::Amount> __l;
  initializer_list<cfd::core::Address> __l_00;
  bool bVar1;
  AssertionResult gtest_ar;
  ConfidentialTransactionContext tx;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addresses;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> el_list;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> amounts;
  string tx_hex;
  string *in_stack_fffffffffffffa68;
  Address *in_stack_fffffffffffffa70;
  char (*in_stack_fffffffffffffa78) [661];
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *in_stack_fffffffffffffa80;
  char *in_stack_fffffffffffffa88;
  allocator_type *in_stack_fffffffffffffa98;
  undefined7 in_stack_fffffffffffffaa0;
  undefined1 in_stack_fffffffffffffaa7;
  iterator in_stack_fffffffffffffaa8;
  size_type in_stack_fffffffffffffab0;
  Address *pAVar2;
  Address *local_548;
  AssertHelper local_510;
  Message local_508;
  string local_500 [24];
  undefined8 in_stack_fffffffffffffb18;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *in_stack_fffffffffffffb20;
  uint32_t in_stack_fffffffffffffb2c;
  ConfidentialTransactionContext *in_stack_fffffffffffffb30;
  allocator local_411;
  string local_410;
  allocator local_3e9;
  string local_3e8;
  Address *local_3c8;
  Address local_3c0;
  Address local_248;
  Address *local_d0;
  undefined8 local_c8;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_a8;
  Amount local_88;
  Amount local_78;
  Amount *local_68;
  pointer local_60;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28,
             "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"
             ,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  cfd::core::Amount::Amount(&local_88,9000000);
  cfd::core::Amount::Amount(&local_78,500000);
  local_68 = &local_88;
  local_60 = (pointer)0x2;
  std::allocator<cfd::core::Amount>::allocator((allocator<cfd::core::Amount> *)0x22b955);
  __l._M_len = in_stack_fffffffffffffab0;
  __l._M_array = (iterator)in_stack_fffffffffffffaa8;
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::vector
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),__l,
             (allocator_type *)in_stack_fffffffffffffa98);
  std::allocator<cfd::core::Amount>::~allocator((allocator<cfd::core::Amount> *)0x22b986);
  cfd::core::GetElementsAddressFormatList();
  local_3c8 = &local_3c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3e8,"ert1qz33wef9ehrvd7c64p27jf5xtvn50946xeekx50",&local_3e9);
  cfd::core::Address::Address(&local_3c0,&local_3e8,&local_a8);
  local_3c8 = &local_248;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_410,"XWMioJVK77vhKHgnSpaCcSBDgf93LFHzYg",&local_411)
  ;
  cfd::core::Address::Address(&local_248,&local_410,&local_a8);
  local_d0 = &local_3c0;
  local_c8._0_4_ = kVersion2;
  local_c8._4_4_ = 0;
  std::allocator<cfd::core::Address>::allocator((allocator<cfd::core::Address> *)0x22ba8d);
  __l_00._M_len = in_stack_fffffffffffffab0;
  __l_00._M_array = in_stack_fffffffffffffaa8;
  std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::vector
            ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
             CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),__l_00,
             in_stack_fffffffffffffa98);
  std::allocator<cfd::core::Address>::~allocator((allocator<cfd::core::Address> *)0x22babe);
  pAVar2 = &local_3c0;
  local_548 = (Address *)&local_d0;
  do {
    local_548 = local_548 + -1;
    cfd::core::Address::~Address(in_stack_fffffffffffffa70);
  } while (local_548 != pAVar2);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  cfd::ConfidentialTransactionContext::SplitTxOut
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,in_stack_fffffffffffffb20,
             (vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
             in_stack_fffffffffffffb18);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_500,(AbstractTransaction *)&stack0xfffffffffffffb30);
  testing::internal::EqHelper<false>::Compare<char[661],std::__cxx11::string>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa70);
  std::__cxx11::string::~string(local_500);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffb20);
  if (!bVar1) {
    testing::Message::Message(&local_508);
    in_stack_fffffffffffffa70 =
         (Address *)testing::AssertionResult::failure_message((AssertionResult *)0x22be40);
    testing::internal::AssertHelper::AssertHelper
              (&local_510,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x3b6,(char *)in_stack_fffffffffffffa70);
    testing::internal::AssertHelper::operator=(&local_510,&local_508);
    testing::internal::AssertHelper::~AssertHelper(&local_510);
    testing::Message::~Message((Message *)0x22be9d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x22bef2);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_fffffffffffffa70);
  std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
            (in_stack_fffffffffffffa80);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffffa80);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::~vector
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             in_stack_fffffffffffffa80);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(TransactionContext, SplitTxOutByAddress)
{
  std::string tx_hex = "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000";
  // 99500000
  std::vector<Amount> amounts = {
    Amount(int64_t{9000000}), Amount(int64_t{500000})};
  auto el_list = cfd::core::GetElementsAddressFormatList();
  std::vector<Address> addresses = {
    Address("ert1qz33wef9ehrvd7c64p27jf5xtvn50946xeekx50", el_list),
    Address("XWMioJVK77vhKHgnSpaCcSBDgf93LFHzYg", el_list)};

  ConfidentialTransactionContext tx(tx_hex);
  tx.SplitTxOut(0, amounts, addresses);
  EXPECT_EQ(
    "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0401f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f0100000000055d4a800374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000001f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000895440001600141462eca4b9b8d8df63550abd24d0cb64e8f2d74601f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a1200017a914d081b8e259b744aa903e1831cfce8956941273ce8700000000",
    tx.GetHex());
}